

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_declare(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  char *__s1;
  int iVar1;
  _canvasenvironment *p_Var2;
  t_symbol *ptVar3;
  t_namelist *ptVar4;
  _glist *x_00;
  _glist *canvas;
  int iVar5;
  byte *dir;
  byte *pbVar6;
  byte local_418 [999];
  undefined1 local_31;
  int which;
  
  x_00 = (_glist *)argv;
  p_Var2 = canvas_getenv(x);
  iVar5 = 0;
LAB_00135cde:
  if (argc <= iVar5) {
    return;
  }
  ptVar3 = atom_getsymbolarg(iVar5,argc,argv);
  __s1 = ptVar3->s_name;
  which = iVar5 + 1;
  if (which < argc) {
    ptVar3 = atom_getsymbolarg(which,argc,argv);
    dir = (byte *)ptVar3->s_name;
    if (dir == (byte *)0x0) goto LAB_00135d6d;
    iVar1 = strcmp(__s1,"-path");
    if (iVar1 == 0) {
      iVar5 = sys_isabsolutepath((char *)dir);
      if (iVar5 == 0) {
        x_00 = (_glist *)(ulong)*dir;
        if (*dir == 0x2e) {
          if (dir[1] == 0x2f) goto LAB_001360e1;
          iVar5 = dir[1] - 0x2e;
          if (iVar5 == 0) {
            x_00 = (_glist *)(ulong)dir[2];
            iVar5 = 0x2f;
            goto LAB_00135ea8;
          }
          iVar5 = -iVar5;
        }
        else {
          iVar5 = 0x2e;
LAB_00135ea8:
          iVar5 = iVar5 - (int)x_00;
        }
        if (iVar5 != 0) {
          canvas_completepath((char *)dir,(char *)local_418,(int)x,x_00);
          iVar5 = check_exists((char *)local_418);
          if (iVar5 == 0) {
            ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
            do {
              ptVar4 = ptVar4->nl_next;
              if (ptVar4 == (t_namelist *)0x0) {
                ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
                goto LAB_0013609a;
              }
              x_00 = (_glist *)ptVar4->nl_string;
              snprintf((char *)local_418,999,"%s/%s/",x_00,dir);
              local_31 = 0;
              iVar5 = check_exists((char *)local_418);
            } while (iVar5 == 0);
            goto LAB_001360dc;
          }
        }
      }
      goto LAB_001360e1;
    }
    iVar1 = strcmp(__s1,"-stdpath");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"-lib");
      if (iVar1 == 0) {
        iVar5 = sys_isabsolutepath((char *)dir);
        canvas = x;
        if (iVar5 == 0) {
          x_00 = (_glist *)(ulong)*dir;
          if (*dir == 0x2e) {
            if (dir[1] == 0x2f) goto LAB_00135e99;
            iVar5 = dir[1] - 0x2e;
            if (iVar5 == 0) {
              x_00 = (_glist *)(ulong)dir[2];
              iVar5 = 0x2f;
              goto LAB_00135ff8;
            }
            iVar5 = -iVar5;
          }
          else {
            iVar5 = 0x2e;
LAB_00135ff8:
            iVar5 = iVar5 - (int)x_00;
          }
          if (iVar5 != 0) {
            canvas_completepath((char *)dir,(char *)local_418,(int)x,x_00);
            iVar5 = sys_load_lib(x,(char *)dir);
            if (iVar5 == 0) {
              ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_searchpath;
              do {
                ptVar4 = ptVar4->nl_next;
                if (ptVar4 == (t_namelist *)0x0) break;
                x_00 = (_glist *)ptVar4->nl_string;
                snprintf((char *)local_418,999,"%s/%s",x_00,dir);
                local_31 = 0;
                iVar5 = sys_load_lib(x,(char *)local_418);
              } while (iVar5 == 0);
            }
            goto LAB_00135d81;
          }
        }
LAB_00135e99:
        sys_load_lib(canvas,(char *)dir);
      }
      else {
        iVar1 = strcmp(__s1,"-stdlib");
        if (iVar1 != 0) goto LAB_00135d6d;
        iVar5 = sys_isabsolutepath((char *)dir);
        if (iVar5 != 0) {
          canvas = (_glist *)0x0;
          goto LAB_00135e99;
        }
        iVar5 = strncmp("extra/",(char *)dir,6);
        pbVar6 = dir + 6;
        if (iVar5 != 0) {
          pbVar6 = dir;
        }
        canvas_completepath((char *)pbVar6,(char *)local_418,0,x_00);
        iVar5 = sys_load_lib((_glist *)0x0,(char *)local_418);
        if (iVar5 == 0) {
          ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
          do {
            ptVar4 = ptVar4->nl_next;
            if (ptVar4 == (t_namelist *)0x0) break;
            x_00 = (_glist *)ptVar4->nl_string;
            snprintf((char *)local_418,999,"%s/%s",x_00,pbVar6);
            local_31 = 0;
            iVar5 = sys_load_lib((_glist *)0x0,(char *)local_418);
          } while (iVar5 == 0);
        }
      }
      goto LAB_00135d81;
    }
    iVar5 = sys_isabsolutepath((char *)dir);
    if (iVar5 == 0) {
      iVar5 = strncmp("extra/",(char *)dir,6);
      pbVar6 = dir + 6;
      if (iVar5 != 0) {
        pbVar6 = dir;
      }
      dir = local_418;
      canvas_completepath((char *)pbVar6,(char *)dir,0,x_00);
      iVar5 = check_exists((char *)dir);
      if (iVar5 != 0) goto LAB_001360e1;
      ptVar4 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
      do {
        ptVar4 = ptVar4->nl_next;
        if (ptVar4 == (t_namelist *)0x0) goto LAB_00135d81;
        x_00 = (_glist *)ptVar4->nl_string;
        snprintf((char *)local_418,999,"%s/%s/",x_00,pbVar6);
        local_31 = 0;
        iVar5 = check_exists((char *)local_418);
      } while (iVar5 == 0);
      goto LAB_001360dc;
    }
    goto LAB_001360e1;
  }
LAB_00135d6d:
  post("declare: %s: unknown declaration",__s1);
  which = iVar5;
  goto LAB_00135d81;
  while( true ) {
    x_00 = (_glist *)ptVar4->nl_string;
    snprintf((char *)local_418,999,"%s/%s/",x_00,dir);
    local_31 = 0;
    iVar5 = check_exists((char *)local_418);
    if (iVar5 != 0) break;
LAB_0013609a:
    ptVar4 = ptVar4->nl_next;
    if (ptVar4 == (t_namelist *)0x0) goto LAB_00135d81;
  }
LAB_001360dc:
  dir = local_418;
LAB_001360e1:
  ptVar4 = namelist_append(p_Var2->ce_path,(char *)dir,0);
  p_Var2->ce_path = ptVar4;
LAB_00135d81:
  iVar5 = which + 1;
  goto LAB_00135cde;
}

Assistant:

void canvas_declare(t_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_canvasenvironment *e = canvas_getenv(x);
#if 0
    startpost("declare:: %s", s->s_name);
    postatom(argc, argv);
    endpost();
#endif
    for (i = 0; i < argc; i++)
    {
        const char *flag = atom_getsymbolarg(i, argc, argv)->s_name;
        const char *item = (argc > i+1)?atom_getsymbolarg(i+1, argc, argv)->s_name:0;
        if ((item) && !strcmp(flag, "-path"))
        {
            canvas_path(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdpath"))
        {
            canvas_stdpath(e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-lib"))
        {
            canvas_lib(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdlib"))
        {
            canvas_stdlib(e, item);
            i++;
        }
        else post("declare: %s: unknown declaration", flag);
    }
}